

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LLVMSlicer.h
# Opt level: O0

void __thiscall
dg::llvmdg::LLVMSlicer::sliceGraph(LLVMSlicer *this,LLVMDependenceGraph *graph,uint32_t slice_id)

{
  LLVMNode *this_00;
  bool bVar1;
  uint32_t uVar2;
  iterator graph_00;
  pointer ppVar3;
  LLVMNode *pLVar4;
  uint32_t in_EDX;
  DependenceGraph<dg::LLVMNode> *in_RSI;
  undefined8 *in_RDI;
  LLVMNode *n;
  iterator E;
  iterator I;
  undefined4 in_stack_00000030;
  DependenceGraph<dg::LLVMNode> *in_stack_00000048;
  Slicer<dg::LLVMNode> *in_stack_00000050;
  uint32_t in_stack_0000009c;
  LLVMDependenceGraph *in_stack_000000a0;
  LLVMNode *in_stack_ffffffffffffffb8;
  LLVMNode *in_stack_ffffffffffffffc0;
  _Self local_28;
  
  Slicer<dg::LLVMNode>::sliceBBlocks(in_stack_00000050,in_stack_00000048,this._4_4_);
  adjustBBlocksSucessors(in_stack_000000a0,in_stack_0000009c);
  graph_00 = DependenceGraph<dg::LLVMNode>::begin
                       ((DependenceGraph<dg::LLVMNode> *)in_stack_ffffffffffffffb8);
  local_28._M_node =
       (_Base_ptr)
       DependenceGraph<dg::LLVMNode>::end
                 ((DependenceGraph<dg::LLVMNode> *)in_stack_ffffffffffffffb8);
  while (bVar1 = std::operator!=((_Self *)&stack0xffffffffffffffe0,&local_28), bVar1) {
    ppVar3 = std::_Rb_tree_iterator<std::pair<llvm::Value_*const,_dg::LLVMNode_*>_>::operator->
                       ((_Rb_tree_iterator<std::pair<llvm::Value_*const,_dg::LLVMNode_*>_> *)
                        0x1ace98);
    this_00 = ppVar3->second;
    std::_Rb_tree_iterator<std::pair<llvm::Value_*const,_dg::LLVMNode_*>_>::operator++
              ((_Rb_tree_iterator<std::pair<llvm::Value_*const,_dg::LLVMNode_*>_> *)
               in_stack_ffffffffffffffc0);
    in_stack_ffffffffffffffc0 = this_00;
    pLVar4 = DependenceGraph<dg::LLVMNode>::getExit(in_RSI);
    if (in_stack_ffffffffffffffc0 != pLVar4) {
      in_RDI[10] = in_RDI[10] + 1;
      Node<dg::LLVMDependenceGraph,_llvm::Value_*,_dg::LLVMNode>::getKey
                (&this_00->super_Node<dg::LLVMDependenceGraph,_llvm::Value_*,_dg::LLVMNode>);
      bVar1 = shouldSliceInst((Value *)in_stack_ffffffffffffffb8);
      if ((bVar1) &&
         (uVar2 = Node<dg::LLVMDependenceGraph,_llvm::Value_*,_dg::LLVMNode>::getSlice
                            (&this_00->
                              super_Node<dg::LLVMDependenceGraph,_llvm::Value_*,_dg::LLVMNode>),
         uVar2 != in_EDX)) {
        (**(code **)*in_RDI)(in_RDI,this_00);
        DependenceGraph<dg::LLVMNode>::deleteNode
                  ((DependenceGraph<dg::LLVMNode> *)in_stack_ffffffffffffffc0,
                   in_stack_ffffffffffffffb8);
        in_RDI[0xb] = in_RDI[0xb] + 1;
      }
    }
  }
  reconnectLLLVMBasicBlocks((LLVMDependenceGraph *)graph_00._M_node);
  ensureEntryBlock((LLVMDependenceGraph *)CONCAT44(slice_id,in_stack_00000030));
  return;
}

Assistant:

void sliceGraph(LLVMDependenceGraph *graph, uint32_t slice_id) {
        // first slice away bblocks that should go away
        sliceBBlocks(graph, slice_id);

        // make graph complete
        adjustBBlocksSucessors(graph, slice_id);

        // now slice away instructions from BBlocks that left
        for (auto I = graph->begin(), E = graph->end(); I != E;) {
            LLVMNode *n = I->second;
            // shift here, so that we won't corrupt the iterator
            // by deleteing the node
            ++I;

            // we added this node artificially and
            // we don't want to slice it away or
            // take any other action on it
            if (n == graph->getExit())
                continue;

            ++statistics.nodesTotal;

            // keep instructions like ret or unreachable
            // FIXME: if this is ret of some value, then
            // the value is undef now, so we should
            // replace it by void ref
            if (!shouldSliceInst(n->getKey()))
                continue;

            /*
            if (llvm::isa<llvm::CallInst>(n->getKey()))
                sliceCallNode(n, slice_id);
                */

            if (n->getSlice() != slice_id) {
                removeNode(n);
                graph->deleteNode(n);
                ++statistics.nodesRemoved;
            }
        }

        // create new CFG edges between blocks after slicing
        reconnectLLLVMBasicBlocks(graph);

        // if we sliced away entry block, our new entry block
        // may have predecessors, which is not allowed in the
        // LLVM
        ensureEntryBlock(graph);
    }